

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::clear_value
          (CustomLayerParams_CustomLayerParamValue *this)

{
  undefined8 *puVar1;
  
  if ((this->_oneof_case_[0] == 0x14) &&
     (puVar1 = *(undefined8 **)&(this->value_).intvalue_,
     puVar1 != (undefined8 *)0x0 &&
     puVar1 != &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
    operator_delete(puVar1,0x20);
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  switch (value_case()) {
    case kDoubleValue: {
      // No need to clear
      break;
    }
    case kStringValue: {
      value_.stringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kIntValue: {
      // No need to clear
      break;
    }
    case kLongValue: {
      // No need to clear
      break;
    }
    case kBoolValue: {
      // No need to clear
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}